

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tqapi_ffi_tapi.cpp
# Opt level: O1

void tqapi_tapi_free_query_result(TradeApi *tapi,QueryResult *result)

{
  QueryResultData *pQVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  
  pQVar1 = result->_data;
  if (pQVar1 != (QueryResultData *)0x0) {
    pcVar2 = (pQVar1->result).msg._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &(pQVar1->result).msg.field_2) {
      operator_delete(pcVar2);
    }
    this = (pQVar1->result).value.
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    operator_delete(pQVar1);
  }
  operator_delete(result);
  return;
}

Assistant:

void tqapi_tapi_free_query_result (TradeApi* tapi, QueryResult * result)
    {
        delete result->_data;
        delete result;
    }